

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<CPP::WriteInitialization::Buddy>::
emplace<CPP::WriteInitialization::Buddy>
          (QMovableArrayOps<CPP::WriteInitialization::Buddy> *this,qsizetype i,Buddy *args)

{
  Buddy **ppBVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  Buddy local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
           super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
        super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size == i) {
      qVar4 = QArrayDataPointer<CPP::WriteInitialization::Buddy>::freeSpaceAtEnd
                        ((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)this);
      if (qVar4 == 0) goto LAB_001340d7;
      CPP::WriteInitialization::Buddy::Buddy
                ((this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                 super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr +
                 (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                 super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size,args);
LAB_001341c6:
      pqVar2 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00134185;
    }
LAB_001340d7:
    if (i == 0) {
      qVar4 = QArrayDataPointer<CPP::WriteInitialization::Buddy>::freeSpaceAtBegin
                        ((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)this);
      if (qVar4 != 0) {
        CPP::WriteInitialization::Buddy::Buddy
                  ((this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                   super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr + -1,args);
        ppBVar1 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                   super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
        *ppBVar1 = *ppBVar1 + -1;
        goto LAB_001341c6;
      }
    }
  }
  local_58.buddyAttributeName.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_58.buddyAttributeName.d.size = -0x5555555555555556;
  local_58.labelVarName.d.size = -0x5555555555555556;
  local_58.buddyAttributeName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.labelVarName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.labelVarName.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  CPP::WriteInitialization::Buddy::Buddy(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
          super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size != 0;
  QArrayDataPointer<CPP::WriteInitialization::Buddy>::detachAndGrow
            ((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)this,(uint)(i == 0 && bVar5),1,
             (Buddy **)0x0,(QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x0);
  if (i == 0 && bVar5) {
    CPP::WriteInitialization::Buddy::Buddy
              ((this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
               super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr + -1,&local_58);
    ppBVar1 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
               super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
    *ppBVar1 = *ppBVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
              super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<CPP::WriteInitialization::Buddy> *)this,i,1);
    CPP::WriteInitialization::Buddy::Buddy(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  CPP::WriteInitialization::Buddy::~Buddy(&local_58);
LAB_00134185:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }